

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_common.c
# Opt level: O1

EGLDisplay get_egl_display_or_skip(void)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  EGLDisplay pvVar5;
  EGLDisplay unaff_RBX;
  char *pcVar6;
  undefined8 uVar7;
  EGLint minor;
  EGLint major;
  undefined8 uStack_30;
  undefined1 auStack_24 [4];
  EGLDisplay pvStack_20;
  undefined1 local_10 [4];
  undefined1 local_c [4];
  
  pvStack_20 = (EGLDisplay)0x101208;
  lVar4 = XOpenDisplay(0);
  if (lVar4 == 0) {
    pcVar6 = "couldn\'t open display\n";
    uVar7 = 0x4d;
  }
  else {
    pvStack_20 = (EGLDisplay)0x101219;
    pvVar5 = (EGLDisplay)(*_epoxy_eglGetDisplay)(lVar4);
    if (pvVar5 == (EGLDisplay)0x0) {
      pcVar6 = "Couldn\'t get EGL display for X11 Display.\n";
    }
    else {
      pvStack_20 = (EGLDisplay)0x101237;
      iVar2 = (*_epoxy_eglInitialize)(pvVar5,local_c,local_10);
      if (iVar2 != 0) {
        return pvVar5;
      }
      pcVar6 = "eglInitialize() failed\n";
      unaff_RBX = pvVar5;
    }
    uVar7 = 1;
  }
  pvStack_20 = (EGLDisplay)0x10126e;
  errx(uVar7,pcVar6);
  pvStack_20 = unaff_RBX;
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  pvVar5 = get_egl_display_or_skip();
  cVar1 = epoxy_has_egl_extension(pvVar5,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    pcVar6 = "Test requires EGL_KHR_surfaceless_context";
  }
  else {
    iVar2 = (*_epoxy_eglBindAPI)(0x30a2);
    if (iVar2 == 0) {
      pcVar6 = "Couldn\'t initialize EGL with desktop GL\n";
    }
    else {
      iVar2 = (*_epoxy_eglChooseConfig)(pvVar5,init_egl_config_attribs,&uStack_30,1,auStack_24);
      if (iVar2 == 0) {
        pcVar6 = "Couldn\'t get an EGLConfig\n";
      }
      else {
        lVar4 = (*_epoxy_eglCreateContext)(pvVar5,uStack_30,0,init_egl_context_attribs);
        if (lVar4 != 0) {
          (*_epoxy_eglMakeCurrent)(pvVar5,0,0,lVar4);
          cVar1 = epoxy_is_desktop_gl();
          if (cVar1 == '\0') {
            main_cold_1();
          }
          iVar2 = epoxy_gl_version();
          if (iVar2 < 0x14) {
            main_cold_2();
          }
          uVar7 = (*_epoxy_glGetString)(0x1f02);
          printf("GL version: %s\n",uVar7);
          uVar3 = (*_epoxy_glCreateShader)(0x8b30);
          cVar1 = (*_epoxy_glIsShader)(uVar3);
          return (EGLDisplay)(ulong)(cVar1 == '\0');
        }
        pcVar6 = "Couldn\'t create a GL context\n";
      }
    }
  }
  pvVar5 = (EGLDisplay)errx(0x4d,pcVar6);
  return pvVar5;
}

Assistant:

EGLDisplay 
get_egl_display_or_skip(void)
{
    Display *dpy = XOpenDisplay(NULL);
    EGLint major, minor;
    EGLDisplay edpy;
    bool ok;

    if (!dpy)
        errx(77, "couldn't open display\n");
    edpy = eglGetDisplay((EGLNativeDisplayType)dpy);
    if (edpy == EGL_NO_DISPLAY)
        errx(1, "Couldn't get EGL display for X11 Display.\n");

    ok = eglInitialize(edpy, &major, &minor);
    if (!ok)
        errx(1, "eglInitialize() failed\n");

    return edpy;
}